

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uintwide_t_n_binary_ops_template_signed.h
# Opt level: O1

void __thiscall
test_uintwide_t_n_binary_ops_template_signed<512U,_unsigned_int,_void>::initialize
          (test_uintwide_t_n_binary_ops_template_signed<512U,_unsigned_int,_void> *this)

{
  undefined8 *puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer pnVar4;
  pointer pnVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  long lVar13;
  long lVar14;
  
  puVar2 = (this->a_local).
           super__Vector_base<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->a_local).
      super__Vector_base<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar2) {
    (this->a_local).
    super__Vector_base<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar2;
  }
  puVar2 = (this->b_local).
           super__Vector_base<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->b_local).
      super__Vector_base<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar2) {
    (this->b_local).
    super__Vector_base<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar2;
  }
  puVar3 = (this->a_local_signed).
           super__Vector_base<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->a_local_signed).
      super__Vector_base<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar3) {
    (this->a_local_signed).
    super__Vector_base<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar3;
  }
  puVar3 = (this->b_local_signed).
           super__Vector_base<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->b_local_signed).
      super__Vector_base<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar3) {
    (this->b_local_signed).
    super__Vector_base<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puVar3;
  }
  pnVar4 = (this->a_boost).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->a_boost).
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pnVar4) {
    (this->a_boost).
    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pnVar4;
  }
  pnVar4 = (this->b_boost).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->b_boost).
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pnVar4) {
    (this->b_boost).
    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pnVar4;
  }
  pnVar5 = (this->a_boost_signed).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->a_boost_signed).
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pnVar5) {
    (this->a_boost_signed).
    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pnVar5;
  }
  pnVar5 = (this->b_boost_signed).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->b_boost_signed).
      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pnVar5) {
    (this->b_boost_signed).
    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pnVar5;
  }
  std::
  vector<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>_>_>
  ::resize(&this->a_local,
           (this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
           number_of_cases);
  std::
  vector<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>_>_>
  ::resize(&this->b_local,
           (this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
           number_of_cases);
  std::
  vector<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>_>_>
  ::resize(&this->a_local_signed,
           (this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
           number_of_cases);
  std::
  vector<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>_>_>
  ::resize(&this->b_local_signed,
           (this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
           number_of_cases);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::resize(&this->a_boost,
           (this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
           number_of_cases);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::resize(&this->b_boost,
           (this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
           number_of_cases);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::resize(&this->a_boost_signed,
           (this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
           number_of_cases);
  std::
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
  ::resize(&this->b_boost_signed,
           (this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
           number_of_cases);
  test_uintwide_t_n_base::
  get_equal_random_test_values_boost_and_local_n<math::wide_integer::uintwide_t<512u,unsigned_int,void,false>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512u,512u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>,void>
            ((this->a_local).
             super__Vector_base<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->a_boost).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
             number_of_cases);
  test_uintwide_t_n_base::
  get_equal_random_test_values_boost_and_local_n<math::wide_integer::uintwide_t<512u,unsigned_int,void,false>,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512u,512u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>,void>
            ((this->b_local).
             super__Vector_base<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->b_boost).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->super_test_uintwide_t_n_binary_ops_base).super_test_uintwide_t_n_base.
             number_of_cases);
  puVar2 = (this->a_local).
           super__Vector_base<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar13 = (long)(this->a_local).
                 super__Vector_base<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 6;
  if (0 < lVar13) {
    puVar3 = (this->a_local_signed).
             super__Vector_base<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar13 = lVar13 + 1;
    lVar14 = 0;
    do {
      puVar1 = (undefined8 *)((long)(puVar2->values).super_array<unsigned_char,_3UL>.elems + lVar14)
      ;
      uVar6 = *puVar1;
      uVar7 = puVar1[1];
      puVar1 = (undefined8 *)
               ((long)puVar2[5].values.super_array<unsigned_char,_3UL>.elems + lVar14 + 1);
      uVar8 = *puVar1;
      uVar9 = puVar1[1];
      puVar1 = (undefined8 *)
               ((long)puVar2[10].values.super_array<unsigned_char,_3UL>.elems + lVar14 + 2);
      uVar10 = *puVar1;
      uVar11 = puVar1[1];
      puVar1 = (undefined8 *)
               ((long)puVar2[0x10].values.super_array<unsigned_char,_3UL>.elems + lVar14);
      uVar12 = puVar1[1];
      *(undefined8 *)((long)(&puVar3->values + 0x10) + lVar14) = *puVar1;
      ((undefined8 *)((long)(&puVar3->values + 0x10) + lVar14))[1] = uVar12;
      *(undefined8 *)((long)(&puVar3->values + 10) + lVar14 + 2) = uVar10;
      ((undefined8 *)((long)(&puVar3->values + 10) + lVar14 + 2))[1] = uVar11;
      *(undefined8 *)((long)(&puVar3->values + 5) + lVar14 + 1) = uVar8;
      ((undefined8 *)((long)(&puVar3->values + 5) + lVar14 + 1))[1] = uVar9;
      puVar1 = (undefined8 *)((long)(puVar3->values).super_array<unsigned_char,_3UL>.elems + lVar14)
      ;
      *puVar1 = uVar6;
      puVar1[1] = uVar7;
      lVar13 = lVar13 + -1;
      lVar14 = lVar14 + 0x40;
    } while (1 < lVar13);
  }
  puVar2 = (this->b_local).
           super__Vector_base<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar13 = (long)(this->b_local).
                 super__Vector_base<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_false>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 6;
  if (0 < lVar13) {
    puVar3 = (this->b_local_signed).
             super__Vector_base<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>,_std::allocator<math::wide_integer::uintwide_t<512U,_unsigned_int,_void,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar13 = lVar13 + 1;
    lVar14 = 0;
    do {
      puVar1 = (undefined8 *)((long)(puVar2->values).super_array<unsigned_char,_3UL>.elems + lVar14)
      ;
      uVar6 = *puVar1;
      uVar7 = puVar1[1];
      puVar1 = (undefined8 *)
               ((long)puVar2[5].values.super_array<unsigned_char,_3UL>.elems + lVar14 + 1);
      uVar8 = *puVar1;
      uVar9 = puVar1[1];
      puVar1 = (undefined8 *)
               ((long)puVar2[10].values.super_array<unsigned_char,_3UL>.elems + lVar14 + 2);
      uVar10 = *puVar1;
      uVar11 = puVar1[1];
      puVar1 = (undefined8 *)
               ((long)puVar2[0x10].values.super_array<unsigned_char,_3UL>.elems + lVar14);
      uVar12 = puVar1[1];
      *(undefined8 *)((long)(&puVar3->values + 0x10) + lVar14) = *puVar1;
      ((undefined8 *)((long)(&puVar3->values + 0x10) + lVar14))[1] = uVar12;
      *(undefined8 *)((long)(&puVar3->values + 10) + lVar14 + 2) = uVar10;
      ((undefined8 *)((long)(&puVar3->values + 10) + lVar14 + 2))[1] = uVar11;
      *(undefined8 *)((long)(&puVar3->values + 5) + lVar14 + 1) = uVar8;
      ((undefined8 *)((long)(&puVar3->values + 5) + lVar14 + 1))[1] = uVar9;
      puVar1 = (undefined8 *)((long)(puVar3->values).super_array<unsigned_char,_3UL>.elems + lVar14)
      ;
      *puVar1 = uVar6;
      puVar1[1] = uVar7;
      lVar13 = lVar13 + -1;
      lVar14 = lVar14 + 0x40;
    } while (1 < lVar13);
  }
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512u,512u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>const*,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512u,512u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>*>
            ((this->a_boost).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->a_boost).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (this->a_boost_signed).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512u,512u,(boost::multiprecision::cpp_integer_type)0,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>const*,boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512u,512u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,void>,(boost::multiprecision::expression_template_option)1>*>
            ((this->b_boost).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->b_boost).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)0,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (this->b_boost_signed).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_int_backend<512U,_512U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_void>,_(boost::multiprecision::expression_template_option)1>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

auto initialize() -> void override
    {
      a_local.clear();
      b_local.clear();
      a_local_signed.clear();
      b_local_signed.clear();

      a_boost.clear();
      b_boost.clear();
      a_boost_signed.clear();
      b_boost_signed.clear();

      a_local.resize(size());
      b_local.resize(size());
      a_local_signed.resize(size());
      b_local_signed.resize(size());

      a_boost.resize(size());
      b_boost.resize(size());
      a_boost_signed.resize(size());
      b_boost_signed.resize(size());

      get_equal_random_test_values_boost_and_local_n<local_uint_type, boost_uint_type, AllocatorType>(a_local.data(), a_boost.data(), size());
      get_equal_random_test_values_boost_and_local_n<local_uint_type, boost_uint_type, AllocatorType>(b_local.data(), b_boost.data(), size());

      std::copy(a_local.cbegin(), a_local.cend(), a_local_signed.begin());
      std::copy(b_local.cbegin(), b_local.cend(), b_local_signed.begin());

      std::copy(a_boost.cbegin(), a_boost.cend(), a_boost_signed.begin());
      std::copy(b_boost.cbegin(), b_boost.cend(), b_boost_signed.begin());
    }